

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O1

Gia_Man_t * Gia_MiniAigMiter(Mini_Aig_t *p,int *pEquivs)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Gia_Man_t *p_00;
  char *pcVar9;
  Vec_Int_t *p_01;
  int *piVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pGVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  
  iVar8 = p->nSize;
  uVar15 = iVar8 / 2;
  p_00 = Gia_ManStart(iVar8 - (iVar8 >> 0x1f) & 0xfffffffe);
  pcVar9 = (char *)malloc(8);
  builtin_strncpy(pcVar9,"MiniAig",8);
  p_00->pName = pcVar9;
  p_01 = (Vec_Int_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0xe < uVar15 - 1) {
    uVar4 = uVar15;
  }
  p_01->nSize = 0;
  p_01->nCap = uVar4;
  iVar6 = 0;
  if (uVar4 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc((long)(int)uVar4 << 2);
  }
  p_01->pArray = piVar10;
  Vec_IntPush(p_01,0);
  Gia_ManHashAlloc(p_00);
  if (3 < iVar8) {
    uVar4 = 2;
    if (2 < (int)uVar15) {
      uVar4 = uVar15;
    }
    uVar13 = 1;
    iVar6 = 0;
    do {
      iVar5 = Mini_AigNodeIsPi(p,uVar13);
      if (iVar5 == 0) {
        iVar5 = Mini_AigNodeIsPo(p,uVar13);
        if (iVar5 == 0) {
          pGVar12 = (Gia_Man_t *)p;
          iVar5 = Mini_AigNodeIsAnd(p,uVar13);
          if (iVar5 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                          ,0x2e7,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
          }
          iVar5 = Gia_ObjFromMiniFanin0Copy(pGVar12,p_01,p,uVar13);
          iVar7 = Gia_ObjFromMiniFanin1Copy(pGVar12,p_01,p,uVar13);
          iVar5 = Gia_ManHashAnd(p_00,iVar5,iVar7);
        }
        else {
          iVar6 = iVar6 + 1;
          iVar5 = -1;
        }
      }
      else {
        pGVar11 = Gia_ManAppendObj(p_00);
        uVar16 = *(ulong *)pGVar11;
        *(ulong *)pGVar11 = uVar16 | 0x9fffffff;
        *(ulong *)pGVar11 =
             uVar16 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar2 = p_00->pObjs;
        if ((pGVar11 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar11)) {
LAB_007790d5:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar2) >> 2) * -0x55555555);
        pGVar2 = p_00->pObjs;
        if ((pGVar11 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar11)) goto LAB_007790d5;
        iVar5 = (int)((ulong)((long)pGVar11 - (long)pGVar2) >> 2) * 0x55555556;
      }
      Vec_IntPush(p_01,iVar5);
      uVar13 = uVar13 + 1;
    } while (uVar4 != uVar13);
  }
  uVar4 = p_01->nSize;
  if (uVar4 != uVar15) {
    __assert_fail("Vec_IntSize(vCopies) == nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x2ea,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
  }
  if (iVar6 <= p->nRegs) {
    __assert_fail("nPos > Mini_AigRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x2eb,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
  }
  if (3 < iVar8) {
    uVar16 = 2;
    if (2 < (int)uVar15) {
      uVar16 = (ulong)uVar15;
    }
    uVar14 = 1;
    do {
      uVar13 = pEquivs[uVar14];
      if (uVar13 != 0xffffffff) {
        if ((long)(int)uVar4 <= (long)uVar14) {
LAB_007790f4:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((int)uVar13 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if ((int)uVar4 <= (int)(uVar13 >> 1)) goto LAB_007790f4;
        uVar1 = p_01->pArray[uVar13 >> 1];
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar5 = Gia_ManHashXor(p_00,p_01->pArray[uVar14],uVar1 ^ uVar13 & 1);
        Gia_ManAppendCo(p_00,iVar5);
      }
      uVar14 = uVar14 + 1;
    } while (uVar16 != uVar14);
  }
  iVar5 = p_00->vCos->nSize;
  iVar7 = 0;
  if (3 < iVar8) {
    uVar4 = 2;
    if (2 < (int)uVar15) {
      uVar4 = uVar15;
    }
    uVar15 = 1;
    iVar7 = 0;
    do {
      pGVar12 = (Gia_Man_t *)p;
      iVar8 = Mini_AigNodeIsPo(p,uVar15);
      if ((iVar8 != 0) &&
         (iVar8 = iVar7 + 1, bVar3 = iVar6 - p->nRegs <= iVar7, iVar7 = iVar8, bVar3)) {
        iVar8 = Gia_ObjFromMiniFanin0Copy(pGVar12,p_01,p,uVar15);
        Gia_ManAppendCo(p_00,iVar8);
      }
      uVar15 = uVar15 + 1;
    } while (uVar4 != uVar15);
  }
  if (iVar7 != iVar6) {
    __assert_fail("iPos == nPos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x2fe,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
  }
  if (p->nRegs != p_00->vCos->nSize - iVar5) {
    __assert_fail("Mini_AigRegNum(p) == Gia_ManCoNum(pGia) - Temp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x2ff,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  Gia_ManHashStop(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_MiniAigMiter( Mini_Aig_t * p, int * pEquivs )
{
    Gia_Man_t * pGia, * pTemp;
    Vec_Int_t * vCopies;
    int i, iGiaLit = 0, iGiaLit2, nNodes, iPos = 0, nPos = 0, Temp;
    // get the number of nodes
    nNodes = Mini_AigNodeNum(p);
    // create ABC network
    pGia = Gia_ManStart( 2 * nNodes );
    pGia->pName = Abc_UtilStrsav( "MiniAig" );
    // create mapping from MiniAIG objects into ABC objects
    vCopies = Vec_IntAlloc( nNodes );
    Vec_IntPush( vCopies, 0 );
    // iterate through the objects
    Gia_ManHashAlloc( pGia );
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
            iGiaLit = Gia_ManAppendCi(pGia);
        else if ( Mini_AigNodeIsPo( p, i ) )
        {
            nPos++;
            Vec_IntPush( vCopies, -1 );
            continue;
        }
        else if ( Mini_AigNodeIsAnd( p, i ) )
            iGiaLit = Gia_ManHashAnd(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i), Gia_ObjFromMiniFanin1Copy(pGia, vCopies, p, i));
        else assert( 0 );
        Vec_IntPush( vCopies, iGiaLit );
    }
    assert( Vec_IntSize(vCopies) == nNodes );
    assert( nPos > Mini_AigRegNum(p) );
    // create miters for each equiv class
    for ( i = 1; i < nNodes; i++ )
    {
        if ( pEquivs[i] == -1 )
            continue;
        iGiaLit = Vec_IntEntry(vCopies, i);
        iGiaLit2 = Abc_LitNotCond( Vec_IntEntry(vCopies, Abc_Lit2Var(pEquivs[i])), Abc_LitIsCompl(pEquivs[i]) );
        Gia_ManAppendCo( pGia, Gia_ManHashXor(pGia, iGiaLit, iGiaLit2) );
    }
    // create flop inputs
    Temp = Gia_ManCoNum(pGia);
    for ( i = 1; i < nNodes; i++ )
    {
        if ( !Mini_AigNodeIsPo( p, i ) )
            continue;
        if ( iPos++ >= nPos - Mini_AigRegNum(p) )
            Gia_ManAppendCo(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i));
    }
    assert( iPos == nPos );
    assert( Mini_AigRegNum(p) == Gia_ManCoNum(pGia) - Temp );
    Gia_ManSetRegNum( pGia, Mini_AigRegNum(p) );
    Gia_ManHashStop( pGia );
    Vec_IntFree( vCopies );
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return pGia;
}